

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O0

TheoryElement * __thiscall
Potassco::TheoryData::addElement(TheoryData *this,Id_t id,IdSpan *terms,Id_t cId)

{
  bool bVar1;
  TheoryElement *pTVar2;
  TheoryElement **ppTVar3;
  uint in_ESI;
  undefined8 in_RDI;
  uint32_t i;
  undefined4 in_stack_ffffffffffffffb8;
  Id_t in_stack_ffffffffffffffbc;
  RawStack<Potassco::TheoryElement_*> *in_stack_ffffffffffffffc0;
  Id_t c;
  IdSpan *in_stack_ffffffffffffffd0;
  uint local_20;
  
  bVar1 = hasElement((TheoryData *)in_stack_ffffffffffffffd0,(Id_t)((ulong)in_RDI >> 0x20));
  c = (Id_t)((ulong)in_RDI >> 0x20);
  if (bVar1) {
    bVar1 = isNewElement((TheoryData *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    if (bVar1) {
      fail(-2,"const TheoryElement &Potassco::TheoryData::addElement(Id_t, const IdSpan &, Id_t)",
           0xea,"!isNewElement(id)","Redefinition of theory element \'%u\'",(ulong)in_ESI,0);
    }
    elems((TheoryData *)0x26ea55);
    DestroyT::operator()
              ((DestroyT *)in_stack_ffffffffffffffc0,
               (TheoryElement *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  else {
    for (local_20 = numElems((TheoryData *)0x26e9c7); c = (Id_t)((ulong)in_RDI >> 0x20),
        local_20 <= in_ESI; local_20 = local_20 + 1) {
      Data::RawStack<Potassco::TheoryElement_*>::push
                (in_stack_ffffffffffffffc0,
                 (TheoryElement **)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    }
  }
  pTVar2 = TheoryElement::newElement(in_stack_ffffffffffffffd0,c);
  ppTVar3 = elems((TheoryData *)0x26ea84);
  ppTVar3[in_ESI] = pTVar2;
  return pTVar2;
}

Assistant:

const TheoryElement& TheoryData::addElement(Id_t id, const IdSpan& terms, Id_t cId) {
	if (!hasElement(id)) {
		for (uint32_t i = numElems(); i <= id; ++i) { data_->elems.push(); }
	}
	else {
		POTASSCO_REQUIRE(!isNewElement(id), "Redefinition of theory element '%u'", id);
		DestroyT()(elems()[id]);
	}
	return *(elems()[id] = TheoryElement::newElement(terms, cId));
}